

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeFunction.cpp
# Opt level: O0

JavascriptString * __thiscall Js::RuntimeFunction::EnsureSourceString(RuntimeFunction *this)

{
  code *pcVar1;
  JavascriptString *this_00;
  bool bVar2;
  int iVar3;
  int32 propertyId;
  void **ppvVar4;
  DynamicTypeHandler *pDVar5;
  undefined4 *puVar6;
  PropertyString *name;
  JavascriptString *name_00;
  JavascriptString *pJStack_38;
  bool status;
  JavascriptString *functionName;
  JavascriptString *retStr;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  RuntimeFunction *this_local;
  
  library = (JavascriptLibrary *)this;
  scriptContext = (ScriptContext *)RecyclableObject::GetLibrary((RecyclableObject *)this);
  retStr = (JavascriptString *)
           JavascriptLibrary::GetScriptContext((JavascriptLibrary *)scriptContext);
  functionName = (JavascriptString *)0x0;
  if ((this->isDisplayString & 1U) == 0) {
    ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&this->functionNameId);
    if (*ppvVar4 == (void *)0x0) {
      functionName = JavascriptLibrary::GetFunctionDisplayString((JavascriptLibrary *)scriptContext)
      ;
    }
    else {
      pDVar5 = DynamicObject::GetTypeHandler((DynamicObject *)this);
      iVar3 = (*pDVar5->_vptr_DynamicTypeHandler[0x4d])();
      if (iVar3 != 0) {
        pJStack_38 = (JavascriptString *)0x0;
        bVar2 = JavascriptFunction::GetFunctionName
                          (&this->super_JavascriptFunction,&stack0xffffffffffffffc8);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RuntimeFunction.cpp"
                                      ,0x2a,"(status)","status");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        (*(this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
                  (this,0x106,pJStack_38,2,0,0,0xf);
      }
      ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&this->functionNameId);
      bVar2 = TaggedInt::Is(*ppvVar4);
      this_00 = retStr;
      if (bVar2) {
        ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)&this->functionNameId);
        propertyId = TaggedInt::ToInt32(*ppvVar4);
        name = ScriptContext::GetPropertyString((ScriptContext *)this_00,propertyId);
        functionName = JavascriptFunction::GetNativeFunctionDisplayString
                                 ((ScriptContext *)this_00,&name->super_JavascriptString);
      }
      else {
        ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)&this->functionNameId);
        name_00 = VarTo<Js::JavascriptString>(*ppvVar4);
        functionName = JavascriptFunction::GetNativeFunctionDisplayString
                                 ((ScriptContext *)this_00,name_00);
      }
    }
    Memory::WriteBarrierPtr<void>::operator=(&this->functionNameId,functionName);
    this->isDisplayString = true;
    this_local = (RuntimeFunction *)functionName;
  }
  else {
    ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&this->functionNameId);
    this_local = (RuntimeFunction *)VarTo<Js::JavascriptString>(*ppvVar4);
  }
  return (JavascriptString *)this_local;
}

Assistant:

JavascriptString *
    RuntimeFunction::EnsureSourceString()
    {
        JavascriptLibrary* library = this->GetLibrary();
        ScriptContext * scriptContext = library->GetScriptContext();
        JavascriptString * retStr = nullptr;
        if (this->isDisplayString)
        {
            return VarTo<JavascriptString>(this->functionNameId);
        }

        if (this->functionNameId == nullptr)
        {
            retStr = library->GetFunctionDisplayString();
        }
        else
        {
            if (this->GetTypeHandler()->IsDeferredTypeHandler())
            {
                JavascriptString* functionName = nullptr;
                DebugOnly(bool status = ) this->GetFunctionName(&functionName);
                Assert(status);
                this->SetPropertyWithAttributes(PropertyIds::name, functionName, PropertyConfigurable, nullptr);
            }
            if (TaggedInt::Is(this->functionNameId))
            {
                // This has a side-effect where any other code (such as debugger) that uses functionNameId value will now get the value like "function foo() { native code }"
                // instead of just "foo". Alternative ways will need to be devised; if it's not desirable to use this full display name value in those cases.
                retStr = GetNativeFunctionDisplayString(scriptContext, scriptContext->GetPropertyString(TaggedInt::ToInt32(this->functionNameId)));
            }
            else
            {
                retStr = GetNativeFunctionDisplayString(scriptContext, VarTo<JavascriptString>(this->functionNameId));
            }
        }

        this->functionNameId = retStr;
        this->isDisplayString = true;

        return retStr;
    }